

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoProfile.c
# Opt level: O0

void reoProfileWidthPrint(reo_man *p)

{
  uint local_1c;
  int local_18;
  int i;
  int TotalWidth;
  int WidthMax;
  reo_man *p_local;
  
  i = 0;
  local_18 = 0;
  for (local_1c = 0; (int)local_1c <= p->nSupp; local_1c = local_1c + 1) {
    printf("Level = %2d. Width = %3d.\n",(ulong)local_1c,
           (ulong)(uint)p->pPlanes[(int)local_1c].statsWidth);
    if (i < p->pPlanes[(int)local_1c].statsWidth) {
      i = p->pPlanes[(int)local_1c].statsWidth;
    }
    local_18 = p->pPlanes[(int)local_1c].statsWidth + local_18;
  }
  if (p->nWidthCur == local_18) {
    printf("WIDTH: ");
    printf("Maximum = %5d.  ",(ulong)(uint)i);
    printf("Total = %7d.  ",(ulong)(uint)p->nWidthCur);
    printf("Average = %6.2f.\n",(double)((float)local_18 / (float)p->nSupp));
    return;
  }
  __assert_fail("p->nWidthCur == TotalWidth",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoProfile.c"
                ,0x150,"void reoProfileWidthPrint(reo_man *)");
}

Assistant:

void reoProfileWidthPrint( reo_man * p )
{
    int WidthMax;
    int TotalWidth;
    int i;

    WidthMax   = 0;
    TotalWidth = 0;
    for ( i = 0; i <= p->nSupp; i++ )
    {
        printf( "Level = %2d. Width = %3d.\n", i, p->pPlanes[i].statsWidth );
        if ( WidthMax < p->pPlanes[i].statsWidth )
             WidthMax = p->pPlanes[i].statsWidth;
        TotalWidth += p->pPlanes[i].statsWidth;
    }
    assert( p->nWidthCur == TotalWidth );
    printf( "WIDTH: " );
    printf( "Maximum = %5d.  ", WidthMax );
    printf( "Total = %7d.  ", p->nWidthCur );
    printf( "Average = %6.2f.\n", TotalWidth / (float)p->nSupp );
}